

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandSeqSweep(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  int c;
  Fra_Ssw_t *pPars;
  uint local_78;
  Fra_Ssw_t Pars;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  pPars._4_4_ = 0;
  local_78 = 0;
  Pars.nPartSize = 0;
  Pars.nOverSize = 1;
  Pars.nFramesP = 5000;
  Pars.nFramesK = 0;
  Pars.nMaxLevs = 0;
  Pars.nMinDomSize = 0;
  Pars.fUseImps = 0;
  Pars.fRewrite = 0;
  Pars.fFraiging = 0;
  Pars.fLatchCorr = 0;
  Pars.fWriteImps = 0;
  Pars.fSilent = 0;
  Extra_UtilGetoptReset();
LAB_00245a9c:
  iVar1 = Extra_UtilGetopt(argc,argv,"PQNFILirfletvh");
  if (iVar1 == -1) {
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      return 1;
    }
    iVar1 = Abc_NtkIsComb(pNtk_00);
    if (iVar1 != 0) {
      Abc_Print(-1,"The network is combinational (run \"fraig\" or \"fraig_sweep\").\n");
      return 0;
    }
    iVar1 = Abc_NtkIsStrash(pNtk_00);
    if (iVar1 == 0) {
      Abc_Print(-1,"This command works only for structrally hashed networks. Run \"st\".\n");
      return 0;
    }
    if ((1 < Pars.nOverSize) && (Pars.fLatchCorr != 0)) {
      Abc_Print(-1,"Currrently can only use one-hotness for simple induction (K=1).\n");
      return 0;
    }
    if ((Pars.nPartSize != 0) && (Pars.fLatchCorr != 0)) {
      Abc_Print(-1,"Currrently can only use one-hotness without prefix.\n");
      return 0;
    }
    Pars._60_8_ = Abc_NtkDarSeqSweep(pNtk_00,(Fra_Ssw_t *)((long)&pPars + 4));
    if ((Abc_Ntk_t *)Pars._60_8_ == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Sequential sweeping has failed.\n");
      return 1;
    }
    Abc_FrameReplaceCurrentNetwork(pAbc,(Abc_Ntk_t *)Pars._60_8_);
    return 0;
  }
  switch(iVar1) {
  case 0x46:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
      goto LAB_00245f33;
    }
    Pars.nOverSize = atoi(argv[globalUtilOptind]);
    iVar1 = Pars.nOverSize;
    break;
  default:
    goto LAB_00245f33;
  case 0x49:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
      goto LAB_00245f33;
    }
    Pars.nFramesP = atoi(argv[globalUtilOptind]);
    iVar1 = Pars.nFramesP;
    break;
  case 0x4c:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
      goto LAB_00245f33;
    }
    Pars.nFramesK = atoi(argv[globalUtilOptind]);
    iVar1 = Pars.nFramesK;
    break;
  case 0x4e:
    if (globalUtilOptind < argc) {
      Pars.nPartSize = atoi(argv[globalUtilOptind]);
      uVar2 = Pars.nPartSize;
      goto joined_r0x00245bc0;
    }
    Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
    goto LAB_00245f33;
  case 0x50:
    if (globalUtilOptind < argc) goto LAB_00245b16;
    Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
    goto LAB_00245f33;
  case 0x51:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-Q\" should be followed by an integer.\n");
      goto LAB_00245f33;
    }
    local_78 = atoi(argv[globalUtilOptind]);
    uVar2 = local_78;
joined_r0x00245bc0:
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar2 < 0) goto LAB_00245f33;
    goto LAB_00245a9c;
  case 0x65:
    Pars.fFraiging = Pars.fFraiging ^ 1;
    goto LAB_00245a9c;
  case 0x66:
    Pars.fUseImps = Pars.fUseImps ^ 1;
    goto LAB_00245a9c;
  case 0x68:
    goto LAB_00245f33;
  case 0x69:
    Pars.nMaxLevs = Pars.nMaxLevs ^ 1;
    goto LAB_00245a9c;
  case 0x6c:
    Pars.fRewrite = Pars.fRewrite ^ 1;
    goto LAB_00245a9c;
  case 0x72:
    Pars.nMinDomSize = Pars.nMinDomSize ^ 1;
    goto LAB_00245a9c;
  case 0x74:
    Pars.fLatchCorr = Pars.fLatchCorr ^ 1;
    goto LAB_00245a9c;
  case 0x76:
    Pars.fWriteImps = Pars.fWriteImps ^ 1;
    goto LAB_00245a9c;
  }
  globalUtilOptind = globalUtilOptind + 1;
  if (iVar1 < 1) goto LAB_00245f33;
  goto LAB_00245a9c;
LAB_00245b16:
  pPars._4_4_ = atoi(argv[globalUtilOptind]);
  globalUtilOptind = globalUtilOptind + 1;
  if ((int)pPars._4_4_ < 2) {
LAB_00245f33:
    Abc_Print(-2,"usage: ssweep [-PQNFL <num>] [-lrfetvh]\n");
    Abc_Print(-2,"\t         performs sequential sweep using K-step induction\n");
    Abc_Print(-2,"\t-P num : max partition size (0 = no partitioning) [default = %d]\n",
              (ulong)pPars._4_4_);
    Abc_Print(-2,"\t-Q num : partition overlap (0 = no overlap) [default = %d]\n",(ulong)local_78);
    Abc_Print(-2,"\t-N num : number of time frames to use as the prefix [default = %d]\n",
              (ulong)(uint)Pars.nPartSize);
    Abc_Print(-2,"\t-F num : number of time frames for induction (1=simple) [default = %d]\n",
              (ulong)(uint)Pars.nOverSize);
    Abc_Print(-2,"\t-L num : max number of levels to consider (0=all) [default = %d]\n",
              (ulong)(uint)Pars.nFramesK);
    pcVar3 = "no";
    if (Pars.fRewrite != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-l     : toggle latch correspondence only [default = %s]\n",pcVar3);
    pcVar3 = "no";
    if (Pars.nMinDomSize != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-r     : toggle AIG rewriting [default = %s]\n",pcVar3);
    pcVar3 = "no";
    if (Pars.fUseImps != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-f     : toggle fraiging (combinational SAT sweeping) [default = %s]\n",pcVar3);
    pcVar3 = "no";
    if (Pars.fFraiging != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-e     : toggle writing implications as assertions [default = %s]\n",pcVar3);
    pcVar3 = "no";
    if (Pars.fLatchCorr != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-t     : toggle using one-hotness conditions [default = %s]\n",pcVar3);
    pcVar3 = "no";
    if (Pars.fWriteImps != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar3);
    Abc_Print(-2,"\t-h     : print the command usage\n");
    return 1;
  }
  goto LAB_00245a9c;
}

Assistant:

int Abc_CommandSeqSweep( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    Fra_Ssw_t Pars, * pPars = &Pars;
    int c;
    extern Abc_Ntk_t * Abc_NtkDarSeqSweep( Abc_Ntk_t * pNtk, Fra_Ssw_t * pPars );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    pPars->nPartSize  = 0;
    pPars->nOverSize  = 0;
    pPars->nFramesP   = 0;
    pPars->nFramesK   = 1;
    pPars->nMaxImps   = 5000;
    pPars->nMaxLevs   = 0;
    pPars->fUseImps   = 0;
    pPars->fRewrite   = 0;
    pPars->fFraiging  = 0;
    pPars->fLatchCorr = 0;
    pPars->fWriteImps = 0;
    pPars->fUse1Hot   = 0;
    pPars->fVerbose   = 0;
    pPars->TimeLimit  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "PQNFILirfletvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nPartSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nPartSize < 2 )
                goto usage;
            break;
        case 'Q':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Q\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nOverSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nOverSize < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesP = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesP < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesK = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesK <= 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nMaxImps = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nMaxImps <= 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nMaxLevs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nMaxLevs <= 0 )
                goto usage;
            break;
        case 'i':
            pPars->fUseImps ^= 1;
            break;
        case 'r':
            pPars->fRewrite ^= 1;
            break;
        case 'f':
            pPars->fFraiging ^= 1;
            break;
        case 'l':
            pPars->fLatchCorr ^= 1;
            break;
        case 'e':
            pPars->fWriteImps ^= 1;
            break;
        case 't':
            pPars->fUse1Hot ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( -1, "The network is combinational (run \"fraig\" or \"fraig_sweep\").\n" );
        return 0;
    }

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for structrally hashed networks. Run \"st\".\n" );
        return 0;
    }

    if ( pPars->nFramesK > 1 && pPars->fUse1Hot )
    {
        Abc_Print( -1, "Currrently can only use one-hotness for simple induction (K=1).\n" );
        return 0;
    }

    if ( pPars->nFramesP && pPars->fUse1Hot )
    {
        Abc_Print( -1, "Currrently can only use one-hotness without prefix.\n" );
        return 0;
    }

    // get the new network
    pNtkRes = Abc_NtkDarSeqSweep( pNtk, pPars );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Sequential sweeping has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: ssweep [-PQNFL <num>] [-lrfetvh]\n" );
    Abc_Print( -2, "\t         performs sequential sweep using K-step induction\n" );
    Abc_Print( -2, "\t-P num : max partition size (0 = no partitioning) [default = %d]\n", pPars->nPartSize );
    Abc_Print( -2, "\t-Q num : partition overlap (0 = no overlap) [default = %d]\n", pPars->nOverSize );
    Abc_Print( -2, "\t-N num : number of time frames to use as the prefix [default = %d]\n", pPars->nFramesP );
    Abc_Print( -2, "\t-F num : number of time frames for induction (1=simple) [default = %d]\n", pPars->nFramesK );
    Abc_Print( -2, "\t-L num : max number of levels to consider (0=all) [default = %d]\n", pPars->nMaxLevs );
//    Abc_Print( -2, "\t-I num : max number of implications to consider [default = %d]\n", pPars->nMaxImps );
//    Abc_Print( -2, "\t-i     : toggle using implications [default = %s]\n", pPars->fUseImps? "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle latch correspondence only [default = %s]\n", pPars->fLatchCorr? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggle AIG rewriting [default = %s]\n", pPars->fRewrite? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle fraiging (combinational SAT sweeping) [default = %s]\n", pPars->fFraiging? "yes": "no" );
    Abc_Print( -2, "\t-e     : toggle writing implications as assertions [default = %s]\n", pPars->fWriteImps? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle using one-hotness conditions [default = %s]\n", pPars->fUse1Hot? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}